

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O1

void __thiscall
dynamicgraph::SignalPtr<double,_int>::checkCompatibility(SignalPtr<double,_int> *this)

{
  _func_int *p_Var1;
  int iVar2;
  Signal<double,_int> *pSVar3;
  undefined8 *puVar4;
  
  iVar2 = (*this->_vptr_SignalPtr[4])();
  if (((char)iVar2 != '\0') &&
     (this->signalPtr !=
      (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]))) {
    pSVar3 = getPtr(this);
    (*(pSVar3->super_SignalBase<int>)._vptr_SignalBase[0x17])(pSVar3);
    return;
  }
  iVar2 = (*this->_vptr_SignalPtr[6])(this);
  if (((char)iVar2 != '\0') &&
     (this->signalPtr !=
      (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]))) {
    (*this->abstractTransmitter->_vptr_SignalBase[0x17])();
    return;
  }
  p_Var1 = this->_vptr_SignalPtr[-3];
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = *(undefined8 *)(&this->field_0x48 + (long)p_Var1);
  __cxa_throw(puVar4,&double*::typeinfo,0);
}

Assistant:

void SignalPtr<T, Time>::checkCompatibility() {
  if (isPlugged() && (!autoref())) {
    getPtr()->checkCompatibility();
  } else if (isAbstractPluged() && (!autoref())) {
    abstractTransmitter->checkCompatibility();
  } else
    Signal<T, Time>::checkCompatibility();
}